

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int fftm2s(int year,int month,int day,int hour,int minute,double second,int decimals,char *datestr,
          int *status)

{
  int iVar1;
  char local_88 [8];
  char errmsg [81];
  int width;
  int decimals_local;
  double second_local;
  int minute_local;
  int hour_local;
  int day_local;
  int month_local;
  int year_local;
  
  if (*status < 1) {
    *datestr = '\0';
    if ((((year == 0) && (month == 0)) && (day == 0)) ||
       (iVar1 = ffverifydate(year,month,day,status), iVar1 < 1)) {
      if ((hour < 0) || (0x17 < hour)) {
        snprintf(local_88,0x51,"input hour value is out of range 0 - 23: %d (fftm2s)",
                 (ulong)(uint)hour);
        ffpmsg(local_88);
        *status = 0x1a4;
        month_local = 0x1a4;
      }
      else if ((minute < 0) || (0x3b < minute)) {
        snprintf(local_88,0x51,"input minute value is out of range 0 - 59: %d (fftm2s)",
                 (ulong)(uint)minute);
        ffpmsg(local_88);
        *status = 0x1a4;
        month_local = 0x1a4;
      }
      else if ((second < 0.0) || (61.0 <= second)) {
        snprintf(local_88,0x51,"input second value is out of range 0 - 60.999: %f (fftm2s)",second);
        ffpmsg(local_88);
        *status = 0x1a4;
        month_local = 0x1a4;
      }
      else if (decimals < 0x1a) {
        if (decimals == 0) {
          stack0xffffffffffffffd0 = 2;
        }
        else {
          register0x00000000 = decimals + 3;
        }
        if (decimals < 0) {
          sprintf(datestr,"%.4d-%.2d-%.2d",(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)day);
        }
        else if (((year == 0) && (month == 0)) && (day == 0)) {
          sprintf(datestr,"%.2d:%.2d:%0*.*f",second,(ulong)(uint)hour,(ulong)(uint)minute,
                  (ulong)stack0xffffffffffffffd0,(ulong)(uint)decimals);
        }
        else {
          sprintf(datestr,"%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",second,(ulong)(uint)year,
                  (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,minute,
                  stack0xffffffffffffffd0,decimals);
        }
        month_local = *status;
      }
      else {
        snprintf(local_88,0x51,"input decimals value is out of range 0 - 25: %d (fftm2s)",
                 (ulong)(uint)decimals);
        ffpmsg(local_88);
        *status = 0x1a4;
        month_local = 0x1a4;
      }
    }
    else {
      ffpmsg("invalid date (fftm2s)");
      month_local = *status;
    }
  }
  else {
    month_local = *status;
  }
  return month_local;
}

Assistant:

int fftm2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           int hour,          /* I - hour (0 - 23)             */
           int minute,        /* I - minute (0 - 59)           */
           double second,     /* I - second (0. - 60.9999999)  */
           int decimals,      /* I - number of decimal points to write      */
           char *datestr,     /* O - date string: "YYYY-MM-DDThh:mm:ss.ddd" */
                              /*   or "hh:mm:ss.ddd" if year, month day = 0 */
           int   *status)     /* IO - error status             */
/*
  Construct a date and time character string
*/
{
    int width;
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr='\0';

    if (year != 0 || month != 0 || day !=0)
    { 
        if (ffverifydate(year, month, day, status) > 0)
	{
            ffpmsg("invalid date (fftm2s)");
            return(*status);
        }
    }

    if (hour < 0 || hour > 23)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input hour value is out of range 0 - 23: %d (fftm2s)", hour);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (minute < 0 || minute > 59)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input minute value is out of range 0 - 59: %d (fftm2s)", minute);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (second < 0. || second >= 61)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input second value is out of range 0 - 60.999: %f (fftm2s)", second);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (decimals > 25)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input decimals value is out of range 0 - 25: %d (fftm2s)", decimals);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }

    if (decimals == 0)
       width = 2;
    else
       width = decimals + 3;

    if (decimals < 0)
    {
        /* a negative decimals value means return only the date, not time */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);
    }
    else if (year == 0 && month == 0 && day == 0)
    {
        /* return only the time, not the date */
        sprintf(datestr, "%.2d:%.2d:%0*.*f",
            hour, minute, width, decimals, second);
    }
    else
    {
        /* return both the time and date */
        sprintf(datestr, "%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",
            year, month, day, hour, minute, width, decimals, second);
    }
    return(*status);
}